

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall
JetHead::vector<Regex::GroupData>::resize(vector<Regex::GroupData> *this,uint newSize)

{
  long *plVar1;
  GroupData *pGVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = (ulong)newSize;
  if (this->mAllocated < newSize) {
    uVar5 = 0;
    if (this->mAllocated * 2 <= newSize) {
      uVar5 = newSize;
    }
    sizeup(this,uVar5);
  }
  uVar5 = this->mSize;
  if (newSize < uVar5) {
    lVar6 = uVar3 * 0x28 + 0x18;
    uVar7 = uVar3;
    do {
      plVar1 = *(long **)((long)this->mData + lVar6 + -0x10);
      plVar4 = (long *)((long)&this->mData->start_pos + lVar6);
      if (plVar4 != plVar1) {
        operator_delete(plVar1,*plVar4 + 1);
        uVar5 = this->mSize;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar7 < uVar5);
  }
  if (uVar5 < newSize) {
    lVar6 = (ulong)uVar5 * 0x28 + 0x18;
    lVar8 = uVar3 - uVar5;
    do {
      pGVar2 = this->mData;
      *(undefined8 *)((long)pGVar2 + lVar6 + -0x18) = 0;
      *(long *)((long)pGVar2 + lVar6 + -0x10) = (long)&pGVar2->start_pos + lVar6;
      *(undefined8 *)((long)pGVar2 + lVar6 + -8) = 0;
      *(undefined1 *)((long)&pGVar2->start_pos + lVar6) = 0;
      lVar6 = lVar6 + 0x28;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  this->mSize = newSize;
  return;
}

Assistant:

void resize(unsigned newSize)
		{
			// If we need more allocation, do it now
			if (mAllocated < newSize)
			{
				if (newSize < mAllocated * 2)
				{
					sizeup();
				} else {
					sizeup(newSize);
				}
			}

			// If we are shrinking (newSize < mSize), destroy
			// everything that is now off the end of the vector
			for (unsigned i = newSize; i < mSize; i++)
			{
				mData[i].~T();
			}

			// If we are growing (mSize < newSize), then call the
			// default constructor on all the objects we just 
			// implicitly created
			for (unsigned i = mSize; i < newSize; i++)
			{
				new(mData + i) T();
			}
			
			// Remember our new size
			mSize = newSize;
		}